

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
::scan_number(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
              *this)

{
  int iVar1;
  char_int_type cVar2;
  int *piVar3;
  char *pcVar4;
  ulonglong uVar5;
  long lVar6;
  long lVar7;
  longlong lVar8;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
  *this_00;
  long in_RDI;
  longlong x_1;
  unsigned_long_long x;
  char *endptr;
  token_type number_type;
  char_int_type in_stack_ffffffffffffff6c;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
  *in_stack_ffffffffffffff70;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
  *in_stack_ffffffffffffff80;
  char *local_20;
  int local_14;
  
  reset(in_stack_ffffffffffffff80);
  local_14 = 5;
  iVar1 = *(int *)(in_RDI + 0x14);
  if (iVar1 == 0x2d) {
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
LAB_001e8e8c:
    local_14 = 6;
    cVar2 = get(in_stack_ffffffffffffff80);
    if (cVar2 != 0x30) {
      if (8 < cVar2 - 0x31U) {
        *(char **)(in_RDI + 0x70) = "invalid number; expected digit after \'-\'";
        return parse_error;
      }
      add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
LAB_001e8f50:
      do {
        cVar2 = get(in_stack_ffffffffffffff80);
        switch(cVar2) {
        case 0x2e:
          goto switchD_001e8f7c_caseD_2e;
        default:
          goto LAB_001e913a;
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          break;
        case 0x45:
        case 0x65:
          add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          goto LAB_001e9059;
        }
      } while( true );
    }
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  else {
    if (iVar1 != 0x30) {
      if (iVar1 - 0x31U < 9) {
        add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        goto LAB_001e8f50;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x20be,"GGML_ASSERT(%s) failed","false");
      goto LAB_001e8e8c;
    }
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  cVar2 = get(in_stack_ffffffffffffff80);
  if (cVar2 == 0x2e) {
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    goto LAB_001e8fb6;
  }
  if ((cVar2 != 0x45) && (cVar2 != 0x65)) goto LAB_001e913a;
  add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  goto LAB_001e9059;
switchD_001e8f7c_caseD_2e:
  add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
LAB_001e8fb6:
  local_14 = 7;
  cVar2 = get(in_stack_ffffffffffffff80);
  if (9 < cVar2 - 0x30U) {
    *(char **)(in_RDI + 0x70) = "invalid number; expected digit after \'.\'";
    return parse_error;
  }
  add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  while (cVar2 = get(in_stack_ffffffffffffff80), cVar2 - 0x30U < 10) {
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if ((cVar2 != 0x45) && (cVar2 != 0x65)) goto LAB_001e913a;
  add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
LAB_001e9059:
  local_14 = 7;
  cVar2 = get(in_stack_ffffffffffffff80);
  if ((cVar2 == 0x2b) || (cVar2 == 0x2d)) {
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    cVar2 = get(in_stack_ffffffffffffff80);
    if (9 < cVar2 - 0x30U) {
      *(char **)(in_RDI + 0x70) = "invalid number; expected digit after exponent sign";
      return parse_error;
    }
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  else {
    if (9 < cVar2 - 0x30U) {
      *(char **)(in_RDI + 0x70) = "invalid number; expected \'+\', \'-\', or digit after exponent";
      return parse_error;
    }
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  while (cVar2 = get(in_stack_ffffffffffffff80), cVar2 - 0x30U < 10) {
    add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
LAB_001e913a:
  unget(in_stack_ffffffffffffff70);
  local_20 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (local_14 == 5) {
    pcVar4 = (char *)std::__cxx11::string::data();
    uVar5 = strtoull(pcVar4,&local_20,10);
    pcVar4 = local_20;
    lVar6 = std::__cxx11::string::data();
    lVar7 = std::__cxx11::string::size();
    if (pcVar4 != (char *)(lVar6 + lVar7)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x21b5,"GGML_ASSERT(%s) failed",
                 "endptr == token_buffer.data() + token_buffer.size()");
    }
    piVar3 = __errno_location();
    if ((*piVar3 == 0) &&
       (*(ulonglong *)(in_RDI + 0x80) = uVar5, *(ulonglong *)(in_RDI + 0x80) == uVar5)) {
      return value_unsigned;
    }
  }
  else if (local_14 == 6) {
    pcVar4 = (char *)std::__cxx11::string::data();
    lVar8 = strtoll(pcVar4,&local_20,10);
    pcVar4 = local_20;
    lVar6 = std::__cxx11::string::data();
    lVar7 = std::__cxx11::string::size();
    if (pcVar4 != (char *)(lVar6 + lVar7)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x21c5,"GGML_ASSERT(%s) failed",
                 "endptr == token_buffer.data() + token_buffer.size()");
    }
    piVar3 = __errno_location();
    if ((*piVar3 == 0) && (*(longlong *)(in_RDI + 0x78) = lVar8, *(long *)(in_RDI + 0x78) == lVar8))
    {
      return value_integer;
    }
  }
  this_00 = (lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
             *)(in_RDI + 0x88);
  pcVar4 = (char *)std::__cxx11::string::data();
  strtof(this_00,pcVar4,&local_20);
  pcVar4 = local_20;
  lVar6 = std::__cxx11::string::data();
  lVar7 = std::__cxx11::string::size();
  if (pcVar4 != (char *)(lVar6 + lVar7)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x21d6,"GGML_ASSERT(%s) failed",
               "endptr == token_buffer.data() + token_buffer.size()");
  }
  return value_float;
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr; // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }